

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey.h
# Opt level: O0

Kind llbuild::buildsystem::BuildKey::kindForIdentifier(char identifier)

{
  Kind local_c;
  char identifier_local;
  
  switch(identifier) {
  case 'C':
    local_c = Command;
    break;
  case 'D':
    local_c = DirectoryContents;
    break;
  default:
    local_c = Unknown;
    break;
  case 'I':
    local_c = Stat;
    break;
  case 'N':
    local_c = Node;
    break;
  case 'S':
    local_c = DirectoryTreeSignature;
    break;
  case 'T':
    local_c = Target;
    break;
  case 'X':
    local_c = CustomTask;
    break;
  case 'd':
    local_c = FilteredDirectoryContents;
    break;
  case 's':
    local_c = DirectoryTreeStructureSignature;
  }
  return local_c;
}

Assistant:

static Kind kindForIdentifier(char identifier) {
    switch (identifier) {
    case 'C': return Kind::Command;
    case 'D': return Kind::DirectoryContents;
    case 'd': return Kind::FilteredDirectoryContents;
    case 'N': return Kind::Node;
    case 'I': return Kind::Stat;
    case 'S': return Kind::DirectoryTreeSignature;
    case 's': return Kind::DirectoryTreeStructureSignature;
    case 'T': return Kind::Target;
    case 'X': return Kind::CustomTask;
    default:
      return Kind::Unknown;
    }
  }